

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::truncated_normal_dist<double>::operator()(truncated_normal_dist<double> *this,lcg64_shift *r)

{
  double x;
  result_type_conflict2 rVar1;
  
  x = utility::u01xx_traits<double,_1UL,_trng::lcg64_shift>::oo(r);
  rVar1 = icdf(this,x);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf(utility::uniformoo<result_type>(r));
    }